

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void CumulativeSumToAverageRow_C(int32_t *tl,int32_t *bl,int w,int area,uint8_t *dst,int count)

{
  long lVar1;
  float fVar2;
  
  if (0 < count) {
    fVar2 = 1.0 / (float)area;
    lVar1 = 0;
    do {
      dst[lVar1] = (uint8_t)(int)((float)((tl[lVar1] + bl[w + lVar1]) - (bl[lVar1] + tl[w + lVar1]))
                                 * fVar2);
      dst[lVar1 + 1] =
           (uint8_t)(int)((float)((tl[lVar1 + 1] + bl[(long)w + lVar1 + 1]) -
                                 (bl[lVar1 + 1] + tl[(long)w + lVar1 + 1])) * fVar2);
      dst[lVar1 + 2] =
           (uint8_t)(int)((float)((tl[lVar1 + 2] + bl[(w + 2) + lVar1]) -
                                 (bl[lVar1 + 2] + tl[(w + 2) + lVar1])) * fVar2);
      dst[lVar1 + 3] =
           (uint8_t)(int)((float)((tl[lVar1 + 3] + bl[(w + 3) + lVar1]) -
                                 (bl[lVar1 + 3] + tl[(w + 3) + lVar1])) * fVar2);
      lVar1 = lVar1 + 4;
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void CumulativeSumToAverageRow_C(const int32_t* tl,
                                 const int32_t* bl,
                                 int w,
                                 int area,
                                 uint8_t* dst,
                                 int count) {
  float ooa = 1.0f / area;
  int i;
  for (i = 0; i < count; ++i) {
    dst[0] = (uint8_t)((bl[w + 0] + tl[0] - bl[0] - tl[w + 0]) * ooa);
    dst[1] = (uint8_t)((bl[w + 1] + tl[1] - bl[1] - tl[w + 1]) * ooa);
    dst[2] = (uint8_t)((bl[w + 2] + tl[2] - bl[2] - tl[w + 2]) * ooa);
    dst[3] = (uint8_t)((bl[w + 3] + tl[3] - bl[3] - tl[w + 3]) * ooa);
    dst += 4;
    tl += 4;
    bl += 4;
  }
}